

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell_xml.cpp
# Opt level: O0

void __thiscall
UnitcellXMLTest_WriteXML_Test::UnitcellXMLTest_WriteXML_Test(UnitcellXMLTest_WriteXML_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__UnitcellXMLTest_WriteXML_Test_001c34f0;
  return;
}

Assistant:

TEST(UnitcellXMLTest, WriteXML) {
  ptree pt;
  ptree& root = pt.put("LATTICES", "");

  write_xml(root, "simple1d", unitcell::simple(1));
  write_xml(root, "simple2d", unitcell::simple(2));
  write_xml(std::cerr, pt,
    boost::property_tree::xml_writer_make_settings<std::string>(' ', 2));
  
  unitcell cell1, cell2;
  EXPECT_TRUE(read_xml(pt, "simple1d", cell1));
  EXPECT_TRUE(read_xml(pt, "simple1d", cell2));
}